

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O0

void ReadEverything(RawFile *rawPdbFile,DBIStream *dbiStream,DebugInfo *to)

{
  pointer *this;
  ContribInfo *this_00;
  uint uVar1;
  size_t sVar2;
  SectionContribution *pSVar3;
  Module *pMVar4;
  char *pathStr;
  HashRecord *pHVar5;
  Record *record_00;
  PDBSymbol *__n;
  reference ppVar6;
  iterator iVar7;
  iterator iVar8;
  reference pvVar9;
  pointer ppVar10;
  SectionContrib *pSVar11;
  size_type sVar12;
  reference pvVar13;
  reference name;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  PDBSymbol *sym_1;
  iterator __end1_5;
  iterator __begin1_5;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> *__range1_5;
  size_t addedSymbolCount;
  uint32_t rvaSize;
  PDBSymbol *next;
  SectionContrib *contrib_1;
  pair<const_unsigned_int,_unsigned_long> local_428;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false> local_418;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false> local_410;
  iterator it;
  size_t typeSize;
  PDBSymbol *curr;
  size_t i;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  typeSizeCache;
  TypeTable typeTable;
  TPIStream tpiStream;
  pair<const_unsigned_int,_PDBSymbol> *sym;
  iterator __end1_4;
  iterator __begin1_4;
  RVAToSymbolMap *__range1_4;
  size_t symbolCount;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> rvaSortedSymbols;
  Record *record_1;
  HashRecord *hashRecord_1;
  HashRecord *__end1_3;
  HashRecord *__begin1_3;
  ArrayView<PDB::HashRecord> *__range1_3;
  ArrayView<PDB::HashRecord> hashRecords_1;
  PublicSymbolStream publicSymbolStream;
  Record *record;
  HashRecord *hashRecord;
  HashRecord *__end1_2;
  HashRecord *__begin1_2;
  ArrayView<PDB::HashRecord> *__range1_2;
  ArrayView<PDB::HashRecord> hashRecords;
  GlobalSymbolStream globalSymbolStream;
  undefined1 local_200 [8];
  ModuleSymbolStream moduleSymbolStream;
  Module *module_1;
  Module *__end1_1;
  Module *__begin1_1;
  ArrayView<PDB::ModuleInfoStream::Module> *__range1_1;
  size_t processedModuleCount;
  size_t moduleCount;
  ArrayView<PDB::ModuleInfoStream::Module> modules;
  RVAToSymbolMap rvaToSymbol;
  ContribInfo info;
  Module *module;
  bool hasUninitData;
  bool hasInitData;
  bool hasCode;
  uint32_t IMAGE_SCN_CNT_UNINITIALIZED_DATA;
  uint32_t IMAGE_SCN_CNT_INITIALIZED_DATA;
  uint32_t IMAGE_SCN_CNT_CODE;
  SectionContrib contrib;
  uint32_t rva;
  SectionContribution *srcContrib;
  SectionContribution *__end1;
  SectionContribution *__begin1;
  ArrayView<PDB::DBI::SectionContribution> *__range1;
  size_t processedContribsCount;
  size_t sectionContribsSize;
  vector<SectionContrib,_std::allocator<SectionContrib>_> contributions;
  ArrayView<PDB::DBI::SectionContribution> sectionContributions;
  CoalescedMSFStream symbolRecordStream;
  SectionContributionStream sectionContributionStream;
  ModuleInfoStream moduleInfoStream;
  ImageSectionStream imageSectionStream;
  DebugInfo *to_local;
  DBIStream *dbiStream_local;
  RawFile *rawPdbFile_local;
  
  fprintf(_stderr,"[      ]");
  PDB::DBIStream::CreateImageSectionStream
            ((ImageSectionStream *)&moduleInfoStream.m_moduleCount,dbiStream,rawPdbFile);
  PDB::DBIStream::CreateModuleInfoStream
            ((ModuleInfoStream *)&sectionContributionStream.m_count,dbiStream,rawPdbFile);
  PDB::DBIStream::CreateSectionContributionStream
            ((SectionContributionStream *)&symbolRecordStream.m_size,dbiStream,rawPdbFile);
  PDB::DBIStream::CreateSymbolRecordStream
            ((CoalescedMSFStream *)&sectionContributions.m_length,dbiStream,rawPdbFile);
  join_0x00000010_0x00000000_ =
       PDB::SectionContributionStream::GetContributions
                 ((SectionContributionStream *)&symbolRecordStream.m_size);
  std::vector<SectionContrib,_std::allocator<SectionContrib>_>::vector
            ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)&sectionContribsSize);
  sVar2 = PDB::ArrayView<PDB::DBI::SectionContribution>::GetLength
                    ((ArrayView<PDB::DBI::SectionContribution> *)
                     &contributions.
                      super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<SectionContrib,_std::allocator<SectionContrib>_>::reserve
            ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)&sectionContribsSize,sVar2);
  std::vector<ContribInfo,_std::allocator<ContribInfo>_>::reserve(&to->m_Contribs,sVar2);
  __range1 = (ArrayView<PDB::DBI::SectionContribution> *)0x0;
  this = &contributions.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  __end1 = PDB::ArrayView<PDB::DBI::SectionContribution>::begin
                     ((ArrayView<PDB::DBI::SectionContribution> *)this);
  pSVar3 = PDB::ArrayView<PDB::DBI::SectionContribution>::end
                     ((ArrayView<PDB::DBI::SectionContribution> *)this);
  for (; __end1 != pSVar3; __end1 = __end1 + 1) {
    stack0xfffffffffffffee8 = __end1;
    __range1 = (ArrayView<PDB::DBI::SectionContribution> *)((long)&__range1->m_data + 1);
    if (((ulong)__range1 & 0xffff) == 0) {
      auVar17._8_4_ = (int)((ulong)__range1 >> 0x20);
      auVar17._0_8_ = __range1;
      auVar17._12_4_ = 0x45300000;
      auVar20._8_4_ = (int)(sVar2 >> 0x20);
      auVar20._0_8_ = sVar2;
      auVar20._12_4_ = 0x45300000;
      fprintf(_stderr,"\b\b\b\b\b\b\b\b[%5.1f%%]",
              (((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) * 10.0) /
              ((auVar20._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
    }
    contrib.Type = PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                             ((ImageSectionStream *)&moduleInfoStream.m_moduleCount,
                              stack0xfffffffffffffee8->section,stack0xfffffffffffffee8->offset);
    if (contrib.Type == Unknown) {
      fprintf(_stderr,"  Contribution (section %i, offset %i) has invalid RVA\n",
              (ulong)stack0xfffffffffffffee8->section,(ulong)stack0xfffffffffffffee8->offset);
    }
    else {
      memset(&IMAGE_SCN_CNT_INITIALIZED_DATA,0,0x18);
      IMAGE_SCN_CNT_CODE = stack0xfffffffffffffee8->offset;
      IMAGE_SCN_CNT_INITIALIZED_DATA = (uint32_t)stack0xfffffffffffffee8->section;
      contrib.Section = stack0xfffffffffffffee8->size;
      contrib.Offset = (uint32_t)stack0xfffffffffffffee8->moduleIndex;
      bVar14 = (stack0xfffffffffffffee8->characteristics & 0x20) != 0;
      bVar15 = (stack0xfffffffffffffee8->characteristics & 0x40) != 0;
      bVar16 = (stack0xfffffffffffffee8->characteristics & 0x80) != 0;
      if (((!bVar14) || (bVar15)) || (bVar16)) {
        if (((bVar14) || (!bVar15)) || (bVar16)) {
          if (((bVar14) || (bVar15)) || (!bVar16)) {
            contrib.Length = 0;
          }
          else {
            contrib.Length = 3;
          }
        }
        else {
          contrib.Length = 2;
        }
      }
      else {
        contrib.Length = 1;
      }
      pMVar4 = PDB::ModuleInfoStream::GetModule
                         ((ModuleInfoStream *)&sectionContributionStream.m_count,
                          (uint)stack0xfffffffffffffee8->moduleIndex);
      join_0x00000010_0x00000000_ = PDB::ModuleInfoStream::Module::GetName(pMVar4);
      pathStr = PDB::ArrayView<char>::Decay((ArrayView<char> *)&info.size);
      contrib.Compiland = DebugInfo::GetObjectFileIndex(to,pathStr);
      std::vector<SectionContrib,std::allocator<SectionContrib>>::emplace_back<SectionContrib&>
                ((vector<SectionContrib,std::allocator<SectionContrib>> *)&sectionContribsSize,
                 (SectionContrib *)&IMAGE_SCN_CNT_INITIALIZED_DATA);
      this_00 = (ContribInfo *)((long)&rvaToSymbol._M_h._M_single_bucket + 4);
      ContribInfo::ContribInfo(this_00);
      rvaToSymbol._M_h._M_single_bucket._4_4_ = contrib.Compiland;
      info.objectFileIndex = contrib.Length;
      std::vector<ContribInfo,std::allocator<ContribInfo>>::emplace_back<ContribInfo&>
                ((vector<ContribInfo,std::allocator<ContribInfo>> *)&to->m_Contribs,this_00);
    }
  }
  std::
  unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
  ::unordered_map((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
                   *)&modules.m_length);
  std::
  unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
  ::reserve((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
             *)&modules.m_length,0x400);
  _moduleCount = PDB::ModuleInfoStream::GetModules
                           ((ModuleInfoStream *)&sectionContributionStream.m_count);
  sVar2 = PDB::ArrayView<PDB::ModuleInfoStream::Module>::GetLength
                    ((ArrayView<PDB::ModuleInfoStream::Module> *)&moduleCount);
  __range1_1 = (ArrayView<PDB::ModuleInfoStream::Module> *)0x0;
  __end1_1 = PDB::ArrayView<PDB::ModuleInfoStream::Module>::begin
                       ((ArrayView<PDB::ModuleInfoStream::Module> *)&moduleCount);
  pMVar4 = PDB::ArrayView<PDB::ModuleInfoStream::Module>::end
                     ((ArrayView<PDB::ModuleInfoStream::Module> *)&moduleCount);
  for (; __end1_1 != pMVar4; __end1_1 = __end1_1 + 1) {
    moduleSymbolStream.m_stream.m_size = (size_t)__end1_1;
    __range1_1 = (ArrayView<PDB::ModuleInfoStream::Module> *)((long)&__range1_1->m_data + 1);
    if (((ulong)__range1_1 & 0x7f) == 0) {
      auVar21._8_4_ = (int)((ulong)__range1_1 >> 0x20);
      auVar21._0_8_ = __range1_1;
      auVar21._12_4_ = 0x45300000;
      auVar18._8_4_ = (int)(sVar2 >> 0x20);
      auVar18._0_8_ = sVar2;
      auVar18._12_4_ = 0x45300000;
      fprintf(_stderr,"\b\b\b\b\b\b\b\b[%5.1f%%]",
              (((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)__range1_1) - 4503599627370496.0)) * 40.0) /
              ((auVar18._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) + 10.0);
    }
    bVar14 = PDB::ModuleInfoStream::Module::HasSymbolStream
                       ((Module *)moduleSymbolStream.m_stream.m_size);
    if (bVar14) {
      PDB::ModuleInfoStream::Module::CreateSymbolStream
                ((ModuleSymbolStream *)local_200,(Module *)moduleSymbolStream.m_stream.m_size,
                 rawPdbFile);
      globalSymbolStream._32_8_ = &moduleInfoStream.m_moduleCount;
      PDB::ModuleSymbolStream::
      ForEachSymbol<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__0>
                ((ModuleSymbolStream *)local_200,
                 (anon_class_16_2_940a6d11 *)&globalSymbolStream.m_count);
      PDB::ModuleSymbolStream::~ModuleSymbolStream((ModuleSymbolStream *)local_200);
    }
  }
  PDB::DBIStream::CreateGlobalSymbolStream
            ((GlobalSymbolStream *)&hashRecords.m_length,dbiStream,rawPdbFile);
  ___range1_2 = PDB::GlobalSymbolStream::GetRecords((GlobalSymbolStream *)&hashRecords.m_length);
  __end1_2 = PDB::ArrayView<PDB::HashRecord>::begin((ArrayView<PDB::HashRecord> *)&__range1_2);
  pHVar5 = PDB::ArrayView<PDB::HashRecord>::end((ArrayView<PDB::HashRecord> *)&__range1_2);
  for (; __end1_2 != pHVar5; __end1_2 = __end1_2 + 1) {
    record_00 = PDB::GlobalSymbolStream::GetRecord
                          ((GlobalSymbolStream *)&hashRecords.m_length,
                           (CoalescedMSFStream *)&sectionContributions.m_length,__end1_2);
    ProcessSymbol((ImageSectionStream *)&moduleInfoStream.m_moduleCount,record_00,
                  (RVAToSymbolMap *)&modules.m_length);
  }
  PDB::GlobalSymbolStream::~GlobalSymbolStream((GlobalSymbolStream *)&hashRecords.m_length);
  PDB::DBIStream::CreatePublicSymbolStream
            ((PublicSymbolStream *)&hashRecords_1.m_length,dbiStream,rawPdbFile);
  ___range1_3 = PDB::PublicSymbolStream::GetRecords((PublicSymbolStream *)&hashRecords_1.m_length);
  __end1_3 = PDB::ArrayView<PDB::HashRecord>::begin((ArrayView<PDB::HashRecord> *)&__range1_3);
  pHVar5 = PDB::ArrayView<PDB::HashRecord>::end((ArrayView<PDB::HashRecord> *)&__range1_3);
  for (; __end1_3 != pHVar5; __end1_3 = __end1_3 + 1) {
    rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)PDB::PublicSymbolStream::GetRecord
                            ((PublicSymbolStream *)&hashRecords_1.m_length,
                             (CoalescedMSFStream *)&sectionContributions.m_length,__end1_3);
    ProcessSymbol((ImageSectionStream *)&moduleInfoStream.m_moduleCount,
                  (Record *)
                  rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(RVAToSymbolMap *)&modules.m_length);
  }
  PDB::PublicSymbolStream::~PublicSymbolStream((PublicSymbolStream *)&hashRecords_1.m_length);
  std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::vector
            ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount);
  __n = (PDBSymbol *)
        std::
        unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
        ::size((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
                *)&modules.m_length);
  std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::reserve
            ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount,(size_type)__n);
  __end1_4 = std::
             unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
             ::begin((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
                      *)&modules.m_length);
  sym = (pair<const_unsigned_int,_PDBSymbol> *)
        std::
        unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
        ::end((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
               *)&modules.m_length);
  while (bVar14 = std::__detail::operator!=
                            (&__end1_4.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_PDBSymbol>,_false>
                             ,(_Node_iterator_base<std::pair<const_unsigned_int,_PDBSymbol>,_false>
                               *)&sym), bVar14) {
    ppVar6 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_PDBSymbol>,_false,_false>::
             operator*(&__end1_4);
    std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::push_back
              ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount,&ppVar6->second);
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_PDBSymbol>,_false,_false>::
    operator++(&__end1_4);
  }
  std::
  unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
  ::clear((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
           *)&modules.m_length);
  iVar7 = std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::begin
                    ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount);
  iVar8 = std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::end
                    ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount);
  std::
  sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>
            (iVar7._M_current,iVar8._M_current);
  if (__n != (PDBSymbol *)0x0) {
    PDB::CreateTPIStream((TPIStream *)&typeTable.m_stream.m_size,rawPdbFile);
    TypeTable::TypeTable
              ((TypeTable *)&typeSizeCache._M_h._M_single_bucket,
               (TPIStream *)&typeTable.m_stream.m_size);
    std::
    unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::unordered_map((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                     *)&i);
    for (curr = (PDBSymbol *)0x0; curr < __n; curr = (PDBSymbol *)&curr->field_0x1) {
      pvVar9 = std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::operator[]
                         ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount,
                          (size_type)curr);
      if (pvVar9->length == 0) {
        if (pvVar9->typeIndex != 0) {
          it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur =
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>)
               (__node_type *)0x0;
          local_410._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::find((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                       *)&i,&pvVar9->typeIndex);
          local_418._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::end((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)&i);
          bVar14 = std::__detail::operator!=(&local_410,&local_418);
          if (bVar14) {
            ppVar10 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false>
                                  *)&local_410);
            it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur
                 = (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>)
                   ppVar10->second;
          }
          it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur =
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>)
               PDBGetTypeSize((TypeTable *)&typeSizeCache._M_h._M_single_bucket,pvVar9->typeIndex);
          std::pair<const_unsigned_int,_unsigned_long>::pair<unsigned_int_&,_unsigned_long_&,_true>
                    (&local_428,&pvVar9->typeIndex,(unsigned_long *)&it);
          std::
          unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::insert((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)&i,&local_428);
          if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>.
              _M_cur != (__node_type *)0x0) {
            pvVar9->length =
                 (uint32_t)
                 it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>.
                 _M_cur;
          }
        }
        pSVar11 = std::vector<SectionContrib,_std::allocator<SectionContrib>_>::data
                            ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)
                             &sectionContribsSize);
        sVar12 = std::vector<SectionContrib,_std::allocator<SectionContrib>_>::size
                           ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)
                            &sectionContribsSize);
        pSVar11 = ContribFromSectionOffset(pSVar11,sVar12,pvVar9->section,pvVar9->offset);
        if ((pSVar11 != (SectionContrib *)0x0) &&
           ((pSVar11->Length < pvVar9->length || (pvVar9->length == 0)))) {
          pvVar9->length = pSVar11->Length;
        }
        if (curr != (PDBSymbol *)&__n[-1].field_0x37) {
          pvVar13 = std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::operator[]
                              ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount,
                               (size_type)&curr->field_0x1);
          uVar1 = pvVar13->rva - pvVar9->rva;
          if ((uVar1 != 0) && ((uVar1 < pvVar9->length || (pvVar9->length == 0)))) {
            pvVar9->length = uVar1;
          }
        }
      }
    }
    std::
    unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)&i);
    TypeTable::~TypeTable((TypeTable *)&typeSizeCache._M_h._M_single_bucket);
  }
  __range1_5 = (vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)0x0;
  __end1_5 = std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::begin
                       ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount);
  sym_1 = (PDBSymbol *)
          std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::end
                    ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount);
  while (bVar14 = __gnu_cxx::operator!=
                            (&__end1_5,
                             (__normal_iterator<PDBSymbol_*,_std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>_>
                              *)&sym_1), bVar14) {
    name = __gnu_cxx::
           __normal_iterator<PDBSymbol_*,_std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>_>::
           operator*(&__end1_5);
    __range1_5 = (vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)
                 ((long)&(__range1_5->super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
    if (((ulong)__range1_5 & 0xffff) == 0) {
      auVar22._8_4_ = (int)((ulong)__range1_5 >> 0x20);
      auVar22._0_8_ = __range1_5;
      auVar22._12_4_ = 0x45300000;
      auVar19._8_4_ = (int)((ulong)__n >> 0x20);
      auVar19._0_8_ = __n;
      auVar19._12_4_ = 0x45300000;
      fprintf(_stderr,"\b\b\b\b\b\b\b\b[%5.1f%%]",
              (((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)__range1_5) - 4503599627370496.0)) * 50.0) /
              ((auVar19._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)) + 50.0);
    }
    pSVar11 = std::vector<SectionContrib,_std::allocator<SectionContrib>_>::data
                        ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)
                         &sectionContribsSize);
    sVar12 = std::vector<SectionContrib,_std::allocator<SectionContrib>_>::size
                       ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)
                        &sectionContribsSize);
    AddSymbol(pSVar11,sVar12,name->section,name->offset,&name->name,name->length,to);
    __gnu_cxx::__normal_iterator<PDBSymbol_*,_std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>_>::
    operator++(&__end1_5);
  }
  std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::~vector
            ((vector<PDBSymbol,_std::allocator<PDBSymbol>_> *)&symbolCount);
  std::
  unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
                    *)&modules.m_length);
  std::vector<SectionContrib,_std::allocator<SectionContrib>_>::~vector
            ((vector<SectionContrib,_std::allocator<SectionContrib>_> *)&sectionContribsSize);
  PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)&sectionContributions.m_length)
  ;
  PDB::SectionContributionStream::~SectionContributionStream
            ((SectionContributionStream *)&symbolRecordStream.m_size);
  PDB::ModuleInfoStream::~ModuleInfoStream((ModuleInfoStream *)&sectionContributionStream.m_count);
  PDB::ImageSectionStream::~ImageSectionStream
            ((ImageSectionStream *)&moduleInfoStream.m_moduleCount);
  return;
}

Assistant:

static void ReadEverything(const PDB::RawFile& rawPdbFile, const PDB::DBIStream& dbiStream, DebugInfo &to)
{
    fprintf(stderr, "[      ]");

    // create the PDB streams
    const PDB::ImageSectionStream imageSectionStream = dbiStream.CreateImageSectionStream(rawPdbFile);
    const PDB::ModuleInfoStream moduleInfoStream = dbiStream.CreateModuleInfoStream(rawPdbFile);
    const PDB::SectionContributionStream sectionContributionStream = dbiStream.CreateSectionContributionStream(rawPdbFile);
    const PDB::CoalescedMSFStream symbolRecordStream = dbiStream.CreateSymbolRecordStream(rawPdbFile);

    // get all section contributions
    const PDB::ArrayView<PDB::DBI::SectionContribution> sectionContributions = sectionContributionStream.GetContributions();
    std::vector<SectionContrib> contributions;
    size_t sectionContribsSize = sectionContributions.GetLength();
    contributions.reserve(sectionContribsSize);
    to.m_Contribs.reserve(sectionContribsSize);

    size_t processedContribsCount = 0;
    for (const PDB::DBI::SectionContribution& srcContrib : sectionContributions)
    {
        ++processedContribsCount;
        if ((processedContribsCount & 65535) == 0)
            fprintf(stderr, "\b\b\b\b\b\b\b\b[%5.1f%%]", processedContribsCount * 10.0 / sectionContribsSize);

        const uint32_t rva = imageSectionStream.ConvertSectionOffsetToRVA(srcContrib.section, srcContrib.offset);
        if (rva == 0u)
        {
            fprintf(stderr, "  Contribution (section %i, offset %i) has invalid RVA\n", srcContrib.section, srcContrib.offset);
            continue;
        }

        SectionContrib contrib = {};
        contrib.Offset = srcContrib.offset;
        contrib.Section = srcContrib.section;
        contrib.Length = srcContrib.size;
        contrib.Compiland = srcContrib.moduleIndex;

        // from IMAGE_SECTION_HEADER
        const uint32_t IMAGE_SCN_CNT_CODE = 0x20;
        const uint32_t IMAGE_SCN_CNT_INITIALIZED_DATA = 0x40;
        const uint32_t IMAGE_SCN_CNT_UNINITIALIZED_DATA = 0x80;
        bool hasCode = srcContrib.characteristics & IMAGE_SCN_CNT_CODE;
        bool hasInitData = srcContrib.characteristics & IMAGE_SCN_CNT_INITIALIZED_DATA;
        bool hasUninitData = srcContrib.characteristics & IMAGE_SCN_CNT_UNINITIALIZED_DATA;
        if (hasCode && !hasInitData && !hasUninitData)
            contrib.Type = SectionType::Code;
        else if (!hasCode && hasInitData && !hasUninitData)
            contrib.Type = SectionType::Data;
        else if (!hasCode && !hasInitData && hasUninitData)
            contrib.Type = SectionType::BSS;
        else
            contrib.Type = SectionType::Unknown;

        const PDB::ModuleInfoStream::Module& module = moduleInfoStream.GetModule(srcContrib.moduleIndex);
        contrib.ObjFileIndex = to.GetObjectFileIndex(module.GetName().Decay());
        contributions.emplace_back(contrib);

        ContribInfo info;
        info.objectFileIndex = contrib.ObjFileIndex;
        info.sectionType = contrib.Type;
        info.size = contrib.Length;
        to.m_Contribs.emplace_back(info);
    }

    RVAToSymbolMap rvaToSymbol;
    rvaToSymbol.reserve(1024);

    // get symbols from the modules
    const PDB::ArrayView<PDB::ModuleInfoStream::Module> modules = moduleInfoStream.GetModules();
    size_t moduleCount = modules.GetLength();
    size_t processedModuleCount = 0;
    for (const PDB::ModuleInfoStream::Module& module : modules)
    {
        ++processedModuleCount;
        if ((processedModuleCount & 127) == 0)
            fprintf(stderr, "\b\b\b\b\b\b\b\b[%5.1f%%]", 10.0 + processedModuleCount * 40.0 / moduleCount);
        if (!module.HasSymbolStream())
            continue;

        const PDB::ModuleSymbolStream moduleSymbolStream = module.CreateSymbolStream(rawPdbFile);
        moduleSymbolStream.ForEachSymbol([&](const PDB::CodeView::DBI::Record* record)
        {
            ProcessSymbol(imageSectionStream, record, rvaToSymbol);
        });
    }

    // get global symbols
    {
        const PDB::GlobalSymbolStream globalSymbolStream = dbiStream.CreateGlobalSymbolStream(rawPdbFile);
        const PDB::ArrayView<PDB::HashRecord> hashRecords = globalSymbolStream.GetRecords();
        for (const PDB::HashRecord& hashRecord : hashRecords)
        {
            const PDB::CodeView::DBI::Record* record = globalSymbolStream.GetRecord(symbolRecordStream, hashRecord);
            ProcessSymbol(imageSectionStream, record, rvaToSymbol);
        }
    }
    // There can be public function symbols we haven't seen yet in any of the modules, especially for PDBs that don't provide module-specific information.
    {
        const PDB::PublicSymbolStream publicSymbolStream = dbiStream.CreatePublicSymbolStream(rawPdbFile);
        const PDB::ArrayView<PDB::HashRecord> hashRecords = publicSymbolStream.GetRecords();
        for (const PDB::HashRecord& hashRecord : hashRecords)
        {
            const PDB::CodeView::DBI::Record* record = publicSymbolStream.GetRecord(symbolRecordStream, hashRecord);
            ProcessSymbol(imageSectionStream, record, rvaToSymbol);
        }
    }

    // Gather all symbols, sort by RVA, figure out sizes of the ones that did not have a size
    std::vector<PDBSymbol> rvaSortedSymbols;
    const size_t symbolCount = rvaToSymbol.size();
    rvaSortedSymbols.reserve(symbolCount);
    for (const auto& sym : rvaToSymbol)
        rvaSortedSymbols.push_back(sym.second);
    rvaToSymbol.clear();

    std::sort(rvaSortedSymbols.begin(), rvaSortedSymbols.end(), [](const auto& a, const auto& b) { return a.rva < b.rva; });

    if (symbolCount != 0)
    {
        const PDB::TPIStream tpiStream = PDB::CreateTPIStream(rawPdbFile);
        TypeTable typeTable(tpiStream);

        std::unordered_map<uint32_t, size_t> typeSizeCache;

        for (size_t i = 0; i < symbolCount; ++i)
        {
            PDBSymbol& curr = rvaSortedSymbols[i];
            if (curr.length != 0)
                continue;

            // Estimate symbol length by: type size, contribution size, difference between curr and next
            // symbol. Whichever is available and smaller.

            // Type size:
            if (curr.typeIndex != 0)
            {
                size_t typeSize = 0;
                auto it = typeSizeCache.find(curr.typeIndex);
                if (it != typeSizeCache.end())
                {
                    typeSize = it->second;
                }
                {
                    typeSize = PDBGetTypeSize(typeTable, curr.typeIndex);
                    typeSizeCache.insert({curr.typeIndex, typeSize});
                }
                if (typeSize != 0)
                    curr.length = uint32_t(typeSize);
            }

            // Contribution:
            const SectionContrib* contrib = ContribFromSectionOffset(contributions.data(), contributions.size(), curr.section, curr.offset);
            if (contrib && (contrib->Length < curr.length || curr.length == 0))
                curr.length = contrib->Length;

            // Difference between symbols:
            if (i != symbolCount - 1)
            {
                const PDBSymbol& next = rvaSortedSymbols[i + 1];
                uint32_t rvaSize = next.rva - curr.rva;
                if (rvaSize != 0 && (rvaSize < curr.length || curr.length == 0))
                    curr.length = rvaSize;
            }
        }
    }

    // Add symbols to the destination map
    size_t addedSymbolCount = 0;
    for (const PDBSymbol& sym : rvaSortedSymbols)
    {
        ++addedSymbolCount;
        if ((addedSymbolCount & 65535) == 0)
            fprintf(stderr, "\b\b\b\b\b\b\b\b[%5.1f%%]", 50.0 + addedSymbolCount * 50.0 / symbolCount);
        AddSymbol(contributions.data(), contributions.size(), sym.section, sym.offset, sym.name, sym.length, to);
    }
}